

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O3

bool iDynTree::addSensorFramesAsAdditionalFramesToModel(Model *model)

{
  bool bVar1;
  char cVar2;
  SensorType *pSVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  Transform *pTVar8;
  long *plVar9;
  ulong uVar10;
  bool bVar11;
  string err;
  string err_1;
  string linkToWhichTheSensorIsAttachedName;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  int local_1f4;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [10];
  Transform local_f0 [96];
  undefined1 local_90 [96];
  
  local_1f4 = 0;
  bVar11 = true;
  do {
    if (local_1f4 - 1U < 4) {
      pSVar3 = (SensorType *)iDynTree::Model::sensors();
      lVar4 = iDynTree::SensorsList::getNrOfSensors(pSVar3);
      if (lVar4 != 0) {
        uVar10 = 0;
        do {
          pSVar3 = (SensorType *)iDynTree::Model::sensors();
          lVar4 = iDynTree::SensorsList::getSensor(pSVar3,(long)&local_1f4);
          if ((lVar4 == 0) ||
             (plVar5 = (long *)__dynamic_cast(lVar4,&Sensor::typeinfo,&LinkSensor::typeinfo,0),
             plVar5 == (long *)0x0)) {
            return false;
          }
          (**(code **)(*plVar5 + 0x50))(plVar5);
          iDynTree::Model::getLinkName_abi_cxx11_((long)local_150);
          (**(code **)(*plVar5 + 0x10))(local_170,plVar5);
          cVar2 = iDynTree::Model::isFrameNameUsed(model,local_170);
          if (local_170[0] != local_160) {
            operator_delete(local_170[0],local_160[0] + 1);
          }
          if (cVar2 == '\0') {
            (**(code **)(*plVar5 + 0x10))(&local_218,plVar5);
            (**(code **)(*plVar5 + 0x58))(local_90,plVar5);
            cVar2 = iDynTree::Model::addAdditionalFrameToLink(model,local_150,&local_218);
            if (local_218 != &local_208) {
              operator_delete(local_218,local_208 + 1);
            }
            if (cVar2 == '\0') {
              (**(code **)(*plVar5 + 0x10))(&local_1d0);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1d0,0,(char *)0x0,0x1379f0);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_1e0 = *plVar9;
                lStack_1d8 = plVar5[3];
                local_1f0 = &local_1e0;
              }
              else {
                local_1e0 = *plVar9;
                local_1f0 = (long *)*plVar5;
              }
              local_1e8 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_208 = *plVar9;
                lStack_200 = plVar5[3];
                local_218 = &local_208;
              }
              else {
                local_208 = *plVar9;
                local_218 = (long *)*plVar5;
              }
              local_210 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if (local_1f0 != &local_1e0) {
                operator_delete(local_1f0,local_1e0 + 1);
              }
              if (local_1d0 != &local_1c0) {
                operator_delete(local_1d0,local_1c0 + 1);
              }
              iDynTree::reportError("","addSensorFramesAsAdditionalFramesToModel",(char *)local_218)
              ;
              if (local_218 != &local_208) {
                operator_delete(local_218,local_208 + 1);
              }
              bVar11 = false;
            }
          }
          if (local_150[0] != local_140) {
            operator_delete(local_150[0],local_140[0] + 1);
          }
          uVar10 = uVar10 + 1;
          pSVar3 = (SensorType *)iDynTree::Model::sensors();
          uVar6 = iDynTree::SensorsList::getNrOfSensors(pSVar3);
        } while (uVar10 < uVar6);
      }
    }
    if (local_1f4 == 0) {
      pSVar3 = (SensorType *)iDynTree::Model::sensors();
      lVar4 = iDynTree::SensorsList::getNrOfSensors(pSVar3);
      if (lVar4 != 0) {
        uVar10 = 0;
        do {
          pSVar3 = (SensorType *)iDynTree::Model::sensors();
          uVar7 = iDynTree::SensorsList::getSensor(pSVar3,(long)&local_1f4);
          plVar5 = (long *)__dynamic_cast(uVar7,&Sensor::typeinfo,
                                          &SixAxisForceTorqueSensor::typeinfo,0);
          iDynTree::SixAxisForceTorqueSensor::getSecondLinkName_abi_cxx11_();
          (**(code **)(*plVar5 + 0x10))(local_190,plVar5);
          cVar2 = iDynTree::Model::isFrameNameUsed(model,local_190);
          if (local_190[0] != local_180) {
            operator_delete(local_190[0],local_180[0] + 1);
          }
          if (cVar2 == '\0') {
            iDynTree::Transform::Transform((Transform *)local_150);
            pTVar8 = (Transform *)iDynTree::SixAxisForceTorqueSensor::getSecondLinkIndex();
            cVar2 = iDynTree::SixAxisForceTorqueSensor::getLinkSensorTransform((long)plVar5,pTVar8);
            if (cVar2 != '\0') {
              (**(code **)(*plVar5 + 0x10))(&local_1f0,plVar5);
              iDynTree::Transform::Transform(local_f0,(Transform *)local_150);
              cVar2 = iDynTree::Model::addAdditionalFrameToLink(model,&local_218,&local_1f0);
              if (local_1f0 != &local_1e0) {
                operator_delete(local_1f0,local_1e0 + 1);
              }
              if (cVar2 != '\0') goto LAB_0012a667;
            }
            (**(code **)(*plVar5 + 0x10))(local_1b0);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x1379f0);
            plVar9 = plVar5 + 2;
            if ((long *)*plVar5 == plVar9) {
              local_1c0 = *plVar9;
              lStack_1b8 = plVar5[3];
              local_1d0 = &local_1c0;
            }
            else {
              local_1c0 = *plVar9;
              local_1d0 = (long *)*plVar5;
            }
            local_1c8 = plVar5[1];
            *plVar5 = (long)plVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
            plVar9 = plVar5 + 2;
            if ((long *)*plVar5 == plVar9) {
              local_1e0 = *plVar9;
              lStack_1d8 = plVar5[3];
              local_1f0 = &local_1e0;
            }
            else {
              local_1e0 = *plVar9;
              local_1f0 = (long *)*plVar5;
            }
            local_1e8 = plVar5[1];
            *plVar5 = (long)plVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            if (local_1b0[0] != local_1a0) {
              operator_delete(local_1b0[0],local_1a0[0] + 1);
            }
            iDynTree::reportError("","addSensorFramesAsAdditionalFramesToModel",(char *)local_1f0);
            if (local_1f0 != &local_1e0) {
              operator_delete(local_1f0,local_1e0 + 1);
            }
            bVar11 = false;
          }
LAB_0012a667:
          if (local_218 != &local_208) {
            operator_delete(local_218,local_208 + 1);
          }
          uVar10 = uVar10 + 1;
          pSVar3 = (SensorType *)iDynTree::Model::sensors();
          uVar6 = iDynTree::SensorsList::getNrOfSensors(pSVar3);
        } while (uVar10 < uVar6);
      }
    }
    bVar1 = 3 < local_1f4;
    local_1f4 = local_1f4 + 1;
    if (bVar1) {
      return bVar11;
    }
  } while( true );
}

Assistant:

bool addSensorFramesAsAdditionalFramesToModel(Model& model)
    {
        bool ret = true;

        // First, we cycle on all the sensor that are attached to a link, because their frame is easy to add
        // TODO : not super happy about this cycle, but is doing is work well
        for (SensorType type = SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type + 1))
        {
            // TODO : link sensor are extremly widespared and they have all approximatly the same API,
            //        so we need a better way to iterate over them
            if (isLinkSensor(type))
            {
                for (size_t sensIdx = 0; sensIdx < model.sensors().getNrOfSensors(type); ++sensIdx)
                {
                    LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(model.sensors().getSensor(type,sensIdx));
                    if (!linkSensor) {
                        //TODO: error
                        return false;
                    }

                    LinkIndex linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();
                    std::string linkToWhichTheSensorIsAttachedName = model.getLinkName(linkToWhichTheSensorIsAttached);

                    if (!model.isFrameNameUsed(linkSensor->getName()))
                    {
                        // std::cerr << "Adding sensor " << linkSensor->getName() << " to link " << linkToWhichTheSensorIsAttachedName << " as additional frame"<< std::endl;
                        bool ok = model.addAdditionalFrameToLink(linkToWhichTheSensorIsAttachedName,linkSensor->getName(),linkSensor->getLinkSensorTransform());

                        if (!ok)
                        {
                            std::string err = "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor " + linkSensor->getName() + " for unknown reasons";
                            reportError("", "addSensorFramesAsAdditionalFramesToModel", err.c_str());
                            ret = false;
                        }
                    }
                }
            }

            // Explictly address the case of F/T sensors
            if (type == SIX_AXIS_FORCE_TORQUE)
            {
                // We add the sensor frame as an additional frame of the **child** link
                // (as tipically for URDF sensors the child link frame is coincident with the F/T sensor frame
                for (size_t sensIdx = 0; sensIdx < model.sensors().getNrOfSensors(type); ++sensIdx)
                {
                    SixAxisForceTorqueSensor * ftSensor = dynamic_cast<SixAxisForceTorqueSensor*>(model.sensors().getSensor(type,sensIdx));

                    std::string linkToWhichTheSensorIsAttachedName = ftSensor->getSecondLinkName();

                    if (!model.isFrameNameUsed(ftSensor->getName()))
                    {
                        Transform link_H_sensor;
                        bool ok = ftSensor->getLinkSensorTransform(ftSensor->getSecondLinkIndex(),link_H_sensor);
                        ok = ok && model.addAdditionalFrameToLink(linkToWhichTheSensorIsAttachedName,ftSensor->getName(),link_H_sensor);

                        if (!ok)
                        {
                            std::string err = "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor " + ftSensor->getName() + " for unknown reasons";
                            reportError("", "addSensorFramesAsAdditionalFramesToModel", err.c_str());
                            ret = false;
                        }
                    }
                }
            }
        }

        return ret;
    }